

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

void helicsPublicationPublishDataBuffer
               (HelicsPublication pub,HelicsDataBuffer buffer,HelicsError *err)

{
  SmallBuffer *pSVar1;
  HelicsPublication pvVar2;
  defV pubVal;
  data_view local_60;
  _Variadic_union<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  local_40;
  undefined1 local_18;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (pub == (HelicsPublication)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001a8a7c;
    }
    else {
      pvVar2 = (HelicsPublication)0x0;
      if (*pub == -0x684eff5b) {
        pvVar2 = pub;
      }
      if (*pub == -0x684eff5b || err == (HelicsError *)0x0) goto LAB_001a8a7f;
    }
    err->error_code = -3;
    err->message = "The given publication object does not point to a valid object";
  }
LAB_001a8a7c:
  pvVar2 = (HelicsPublication)0x0;
LAB_001a8a7f:
  if (pvVar2 != (HelicsPublication)0x0) {
    pSVar1 = getBuffer(buffer);
    if (pSVar1 == (SmallBuffer *)0x0) {
      helics::Publication::publishString
                (*(Publication **)((long)pvVar2 + 0x18),(string_view)(ZEXT816(0x4482a2) << 0x40));
    }
    else {
      local_40._M_first._M_storage = (_Uninitialized<double,_true>)0.0;
      local_18 = 0;
      local_60.dblock._M_len = pSVar1->bufferSize;
      local_60.dblock._M_str = (char *)pSVar1->heap;
      local_60.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      local_60.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      helics::valueExtract(&local_60,HELICS_UNKNOWN,(defV *)&local_40._M_first);
      if (local_60.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.ref.
                   super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      helics::Publication::publishDefV
                (*(Publication **)((long)pvVar2 + 0x18),(defV *)&local_40._M_first);
      std::__detail::__variant::
      _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                           *)&local_40._M_first);
    }
  }
  return;
}

Assistant:

void helicsPublicationPublishDataBuffer(HelicsPublication pub, HelicsDataBuffer buffer, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        auto* buff = getBuffer(buffer);
        if (buff == nullptr) {
            pubObj->pubPtr->publish("");
            return;
        }
        helics::defV pubVal;
        helics::valueExtract(helics::data_view(*buff), helics::DataType::HELICS_UNKNOWN, pubVal);
        pubObj->pubPtr->publish(pubVal);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}